

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O1

void iterator_extreme_key_test(void)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar4;
  size_t sVar5;
  uint uVar3;
  size_t sVar6;
  fdb_config *pfVar7;
  long lVar8;
  fdb_config *doc_00;
  fdb_doc **doc_01;
  fdb_doc **doc_02;
  char *pcVar9;
  fdb_kvs_handle *doc_03;
  fdb_kvs_handle *unaff_R12;
  ulong uVar10;
  fdb_kvs_handle *unaff_R13;
  fdb_doc **unaff_R14;
  ulong uVar11;
  void *__s1;
  char *unaff_R15;
  fdb_iterator *fit;
  fdb_doc *doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char value [256];
  char key [256];
  char valueBuf [256];
  char keyBuf [256];
  char cmd [256];
  fdb_kvs_handle *pfStack_16f0;
  uint uStack_16e4;
  ulong uStack_16e0;
  fdb_iterator *pfStack_16d8;
  fdb_file_handle *pfStack_16d0;
  fdb_doc **ppfStack_16c8;
  fdb_doc *pfStack_16c0;
  fdb_kvs_info fStack_16b8;
  timeval tStack_1688;
  fdb_kvs_config fStack_1678;
  char acStack_1660 [256];
  fdb_doc *apfStack_1560 [101];
  fdb_config fStack_1238;
  char acStack_1140 [256];
  char acStack_1040 [264];
  fdb_doc **ppfStack_f38;
  char *pcStack_f30;
  ulong uStack_f28;
  char *pcStack_f20;
  long lStack_f18;
  fdb_doc **ppfStack_f10;
  fdb_doc *pfStack_ef8;
  fdb_kvs_handle *pfStack_ef0;
  fdb_iterator *pfStack_ee8;
  fdb_file_handle *pfStack_ee0;
  fdb_doc *apfStack_ed8 [10];
  timeval tStack_e88;
  fdb_kvs_config fStack_e78;
  fdb_config fStack_e60;
  char acStack_d68 [256];
  char acStack_c68 [264];
  fdb_config *pfStack_b60;
  fdb_kvs_handle *pfStack_b58;
  fdb_kvs_handle *pfStack_b50;
  void *pvStack_b48;
  char *pcStack_b40;
  code *pcStack_b38;
  fdb_iterator *pfStack_b28;
  fdb_config *pfStack_b20;
  fdb_kvs_handle *pfStack_b18;
  fdb_kvs_handle *pfStack_b10;
  fdb_file_handle *pfStack_b08;
  bool bStack_afc;
  fdb_kvs_config fStack_af8;
  undefined1 auStack_ae0 [64];
  char acStack_aa0 [256];
  fdb_config fStack_9a0;
  char acStack_8a0 [256];
  fdb_config fStack_7a0;
  fdb_config *pfStack_6a8;
  fdb_kvs_handle *pfStack_6a0;
  fdb_kvs_handle *pfStack_698;
  fdb_doc **ppfStack_690;
  char *pcStack_688;
  fdb_kvs_handle *local_670;
  undefined1 local_668 [24];
  fdb_kvs_config local_650;
  timeval local_638;
  fdb_kvs_handle local_628;
  fdb_config local_420;
  wal_item local_328 [2];
  kvs_ops_stat local_228 [4];
  char local_128 [256];
  
  gettimeofday(&local_638,(__timezone_ptr_t)0x0);
  local_668._0_8_ = (fdb_kvs_handle *)0x0;
  builtin_strncpy(local_128,"rm -rf  iterator_test*",0x17);
  system(local_128);
  memleak_start();
  pfVar7 = &local_420;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  doc_03 = (fdb_kvs_handle *)(local_668 + 0x10);
  fVar1 = fdb_open((fdb_file_handle **)doc_03,"./iterator_test",pfVar7);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011563b;
  doc_03 = (fdb_kvs_handle *)local_668._16_8_;
  fVar1 = fdb_kvs_open((fdb_file_handle *)local_668._16_8_,(fdb_kvs_handle **)(local_668 + 8),
                       (char *)0x0,&local_650);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115640;
  pfVar7 = (fdb_config *)&local_628.config.encryption_key;
  memset(pfVar7,0xff,0x100);
  uVar11 = 1;
  unaff_R15 = "0xff length %d";
  unaff_R12 = &local_628;
  do {
    sprintf((char *)unaff_R12,"0xff length %d",uVar11 & 0xffffffff);
    unaff_R13 = (fdb_kvs_handle *)local_668._8_8_;
    sVar4 = strlen((char *)unaff_R12);
    fdb_set_kv(unaff_R13,pfVar7,uVar11,unaff_R12,sVar4 + 1);
    uVar11 = uVar11 + 1;
  } while (uVar11 != 0x1e);
  fdb_commit((fdb_file_handle *)local_668._16_8_,'\x01');
  doc_03 = (fdb_kvs_handle *)local_668;
  fVar1 = fdb_doc_create((fdb_doc **)doc_03,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
  unaff_R14 = (fdb_doc **)0x1e;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115645;
  *(kvs_ops_stat **)(local_668._0_8_ + 0x20) = local_228;
  *(btree **)(local_668._0_8_ + 0x38) = (btree *)0x0;
  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->seqtree =
       (btree *)local_328;
  doc_03 = (fdb_kvs_handle *)local_668._8_8_;
  fVar1 = fdb_iterator_init((fdb_kvs_handle *)local_668._8_8_,(fdb_iterator **)&local_670,
                            (void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011564a;
  doc_03 = local_670;
  fVar1 = fdb_iterator_seek_to_max((fdb_iterator *)local_670);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011564f;
  pfVar7 = (fdb_config *)0x1d;
  do {
    fVar1 = fdb_iterator_get((fdb_iterator *)local_670,(fdb_doc **)local_668);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    sprintf((char *)&local_628,"0xff length %d",pfVar7);
    unaff_R13 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->seqtree
    ;
    iVar2 = bcmp(unaff_R13,&local_628,(size_t)((fdb_kvs_config *)local_668._0_8_)->custom_cmp_param)
    ;
    if (iVar2 != 0) {
      iterator_extreme_key_test();
      goto LAB_00115614;
    }
    fVar1 = fdb_iterator_prev((fdb_iterator *)local_670);
    pfVar7 = (fdb_config *)(ulong)((int)pfVar7 - 1);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  fVar1 = fdb_iterator_seek((fdb_iterator *)local_670,&local_628.config.encryption_key,8,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar7 = (fdb_config *)0x8;
    do {
      fVar1 = fdb_iterator_get((fdb_iterator *)local_670,(fdb_doc **)local_668);
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      sprintf((char *)&local_628,"0xff length %d",pfVar7);
      unaff_R13 = (fdb_kvs_handle *)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->
                  seqtree;
      iVar2 = bcmp(unaff_R13,&local_628,
                   (size_t)((fdb_kvs_config *)local_668._0_8_)->custom_cmp_param);
      if (iVar2 != 0) goto LAB_00115621;
      fVar1 = fdb_iterator_prev((fdb_iterator *)local_670);
      pfVar7 = (fdb_config *)(ulong)((int)pfVar7 - 1);
    } while (fVar1 == FDB_RESULT_SUCCESS);
  }
  fVar1 = fdb_iterator_seek((fdb_iterator *)local_670,&local_628.config.encryption_key,8,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar7 = (fdb_config *)0x8;
    do {
      fVar1 = fdb_iterator_get((fdb_iterator *)local_670,(fdb_doc **)local_668);
      if (fVar1 != FDB_RESULT_SUCCESS) break;
      sprintf((char *)&local_628,"0xff length %d",pfVar7);
      unaff_R13 = (fdb_kvs_handle *)
                  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->
                  seqtree;
      iVar2 = bcmp(unaff_R13,&local_628,
                   (size_t)((fdb_kvs_config *)local_668._0_8_)->custom_cmp_param);
      if (iVar2 != 0) goto LAB_0011562e;
      fVar1 = fdb_iterator_next((fdb_iterator *)local_670);
      pfVar7 = (fdb_config *)(ulong)((int)pfVar7 + 1);
    } while (fVar1 == FDB_RESULT_SUCCESS);
  }
  unaff_R14 = (fdb_doc **)local_668;
  unaff_R12 = &local_628;
  unaff_R15 = "0xff length %d";
  doc_03 = local_670;
  fVar1 = fdb_iterator_close((fdb_iterator *)local_670);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115654;
  fVar1 = fdb_iterator_init((fdb_kvs_handle *)local_668._8_8_,(fdb_iterator **)&local_670,
                            (void *)0x0,0,&local_628.config.encryption_key,0x100,0);
  doc_03 = (fdb_kvs_handle *)local_668._8_8_;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115659;
  doc_03 = local_670;
  fVar1 = fdb_iterator_seek_to_max((fdb_iterator *)local_670);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011565e;
  pfVar7 = (fdb_config *)0x1d;
  unaff_R14 = (fdb_doc **)local_668;
  unaff_R15 = "0xff length %d";
  unaff_R12 = &local_628;
  do {
    fVar1 = fdb_iterator_get((fdb_iterator *)local_670,unaff_R14);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    sprintf((char *)unaff_R12,"0xff length %d",pfVar7);
    unaff_R13 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->seqtree
    ;
    iVar2 = bcmp(unaff_R13,unaff_R12,(size_t)((fdb_kvs_config *)local_668._0_8_)->custom_cmp_param);
    if (iVar2 != 0) goto LAB_00115614;
    fVar1 = fdb_iterator_prev((fdb_iterator *)local_670);
    pfVar7 = (fdb_config *)(ulong)((int)pfVar7 - 1);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  fVar1 = fdb_iterator_close((fdb_iterator *)local_670);
  doc_03 = local_670;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115663;
  fVar1 = fdb_close((fdb_file_handle *)local_668._16_8_);
  doc_03 = (fdb_kvs_handle *)local_668._16_8_;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115668;
  *(kvs_ops_stat **)(local_668._0_8_ + 0x20) = (kvs_ops_stat *)0x0;
  ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(local_668._0_8_ + 0x40))->seqtree =
       (btree *)0x0;
  doc_03 = (fdb_kvs_handle *)local_668._0_8_;
  fVar1 = fdb_doc_free((fdb_doc *)local_668._0_8_);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011566d;
  fVar1 = fdb_shutdown();
  if (fVar1 == FDB_RESULT_SUCCESS) {
    memleak_end();
    pcVar9 = "%s PASSED\n";
    if (iterator_extreme_key_test()::__test_pass != '\0') {
      pcVar9 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar9,"iterator extreme key test");
    return;
  }
  goto LAB_00115672;
LAB_00115614:
  iterator_extreme_key_test();
LAB_00115621:
  iterator_extreme_key_test();
LAB_0011562e:
  unaff_R14 = (fdb_doc **)local_668;
  unaff_R15 = "0xff length %d";
  unaff_R12 = &local_628;
  doc_03 = unaff_R12;
  iterator_extreme_key_test();
LAB_0011563b:
  iterator_extreme_key_test();
LAB_00115640:
  iterator_extreme_key_test();
LAB_00115645:
  iterator_extreme_key_test();
LAB_0011564a:
  iterator_extreme_key_test();
LAB_0011564f:
  iterator_extreme_key_test();
LAB_00115654:
  iterator_extreme_key_test();
LAB_00115659:
  iterator_extreme_key_test();
LAB_0011565e:
  iterator_extreme_key_test();
LAB_00115663:
  iterator_extreme_key_test();
LAB_00115668:
  iterator_extreme_key_test();
LAB_0011566d:
  iterator_extreme_key_test();
LAB_00115672:
  iterator_extreme_key_test();
  sVar4 = (ulong)doc_03 & 0xffffffff;
  __s1 = (void *)0x0;
  pcStack_b38 = (code *)0x11569c;
  pfStack_6a8 = pfVar7;
  pfStack_6a0 = unaff_R12;
  pfStack_698 = unaff_R13;
  ppfStack_690 = unaff_R14;
  pcStack_688 = unaff_R15;
  gettimeofday((timeval *)(auStack_ae0 + 0x30),(__timezone_ptr_t)0x0);
  pcStack_b38 = (code *)0x1156a1;
  memleak_start();
  pfStack_b20 = (fdb_config *)0x0;
  pcStack_b38 = (code *)0x1156b2;
  system("rm -rf  iterator_test* > errorlog.txt");
  pfVar7 = &fStack_7a0;
  pcStack_b38 = (code *)0x1156c2;
  fdb_get_default_config();
  pcStack_b38 = (code *)0x1156cc;
  fdb_get_default_kvs_config();
  fStack_7a0.buffercache_size = 0;
  fStack_7a0.wal_threshold = 0x400;
  fStack_7a0.flags = 1;
  fStack_7a0.compaction_threshold = '\0';
  pcStack_b38 = (code *)0x1156f7;
  fVar1 = fdb_open(&pfStack_b08,"./iterator_test1",pfVar7);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    _bStack_afc = SUB84(doc_03,0);
    pcStack_b38 = (code *)0x115717;
    fVar1 = fdb_kvs_open_default(pfStack_b08,&pfStack_b10,&fStack_af8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b0c;
    unaff_R13 = (fdb_kvs_handle *)0x0;
    uVar11 = 0;
    do {
      pcStack_b38 = (code *)0x115742;
      sprintf(acStack_8a0,"%c2",(ulong)((int)uVar11 + 0x61));
      pcStack_b38 = (code *)0x11575b;
      sprintf((char *)&fStack_9a0,"meta%d",uVar11 & 0xffffffff);
      pcStack_b38 = (code *)0x115774;
      sprintf(acStack_aa0,"body%d",uVar11 & 0xffffffff);
      unaff_R12 = (fdb_kvs_handle *)(auStack_ae0 + (long)unaff_R13);
      pcStack_b38 = (code *)0x115784;
      sVar4 = strlen(acStack_8a0);
      pfVar7 = &fStack_9a0;
      pcStack_b38 = (code *)0x115797;
      unaff_R15 = (char *)strlen((char *)pfVar7);
      pcStack_b38 = (code *)0x1157a7;
      sVar5 = strlen(acStack_aa0);
      pcStack_b38 = (code *)0x1157cc;
      fdb_doc_create((fdb_doc **)unaff_R12,acStack_8a0,sVar4,pfVar7,(size_t)unaff_R15,acStack_aa0,
                     sVar5);
      pcStack_b38 = (code *)0x1157db;
      fdb_set(pfStack_b10,*(fdb_doc **)(auStack_ae0 + uVar11 * 8));
      uVar11 = uVar11 + 1;
      unaff_R13 = (fdb_kvs_handle *)((long)unaff_R13 + 8);
    } while (uVar11 != 5);
    pcStack_b38 = (code *)0x1157fb;
    fdb_commit(pfStack_b08,bStack_afc);
    pcStack_b38 = (code *)0x115811;
    fVar1 = fdb_snapshot_open(pfStack_b10,&pfStack_b18,0xffffffffffffffff);
    __s1 = (void *)0x5;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b11;
    pcStack_b38 = (code *)0x115831;
    fVar1 = fdb_set_log_callback(pfStack_b10,logCallbackFunc,"iterator_inmem_snapshot_seek_test");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b16;
    pfVar7 = (fdb_config *)&pfStack_b28;
    pcStack_b38 = (code *)0x11586b;
    fdb_iterator_init(pfStack_b18,(fdb_iterator **)pfVar7,"b2",2,"d2",2,0xe);
    pcStack_b38 = (code *)0x115884;
    fVar1 = fdb_iterator_seek(pfStack_b28,"c1",2,'\x01');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b1b;
    pcStack_b38 = (code *)0x1158a5;
    fVar1 = fdb_iterator_seek(pfStack_b28,"c3",2,'\0');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b20;
    pfVar7 = (fdb_config *)&pfStack_b28;
    pcStack_b38 = (code *)0x1158bb;
    fdb_iterator_close(pfStack_b28);
    pcStack_b38 = (code *)0x1158e8;
    fdb_iterator_init(pfStack_b18,(fdb_iterator **)pfVar7,"b3",2,"d1",2,0xe);
    pcStack_b38 = (code *)0x115901;
    fVar1 = fdb_iterator_seek(pfStack_b28,"c1",2,'\x01');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b25;
    pcStack_b38 = (code *)0x115922;
    fVar1 = fdb_iterator_seek(pfStack_b28,"c3",2,'\0');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b2a;
    pfVar7 = (fdb_config *)&pfStack_b28;
    pcStack_b38 = (code *)0x115938;
    fdb_iterator_close(pfStack_b28);
    pcStack_b38 = (code *)0x115965;
    fdb_iterator_init(pfStack_b18,(fdb_iterator **)pfVar7,"b0",2,"e2",2,0xe);
    pcStack_b38 = (code *)0x11596d;
    fVar1 = fdb_iterator_seek_to_max(pfStack_b28);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b2f;
    pcStack_b38 = (code *)0x115984;
    fVar1 = fdb_iterator_get(pfStack_b28,(fdb_doc **)&pfStack_b20);
    doc_00 = pfStack_b20;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b34;
    sVar5._0_2_ = pfStack_b20->chunksize;
    sVar5._2_2_ = *(undefined2 *)&pfStack_b20->field_0x2;
    sVar5._4_4_ = pfStack_b20->blocksize;
    __s1 = *(void **)&pfStack_b20->seqtree_opt;
    pcStack_b38 = (code *)0x1159a7;
    iVar2 = bcmp(__s1,"d2",sVar5);
    if (iVar2 != 0) goto LAB_00115b39;
    pcStack_b38 = (code *)0x1159b7;
    fdb_doc_free((fdb_doc *)doc_00);
    pfStack_b20 = (fdb_config *)0x0;
    pcStack_b38 = (code *)0x1159d8;
    fVar1 = fdb_iterator_seek(pfStack_b28,"e2",2,'\0');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b41;
    pcStack_b38 = (code *)0x1159eb;
    fVar1 = fdb_iterator_seek_to_min(pfStack_b28);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b46;
    pcStack_b38 = (code *)0x115a02;
    fVar1 = fdb_iterator_get(pfStack_b28,(fdb_doc **)&pfStack_b20);
    pfVar7 = pfStack_b20;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115b4b;
    sVar6._0_2_ = pfStack_b20->chunksize;
    sVar6._2_2_ = *(undefined2 *)&pfStack_b20->field_0x2;
    sVar6._4_4_ = pfStack_b20->blocksize;
    __s1 = *(void **)&pfStack_b20->seqtree_opt;
    pcStack_b38 = (code *)0x115a25;
    iVar2 = bcmp(__s1,"c2",sVar6);
    if (iVar2 != 0) goto LAB_00115b50;
    pcStack_b38 = (code *)0x115a35;
    fdb_doc_free((fdb_doc *)pfVar7);
    pcStack_b38 = (code *)0x115a50;
    fVar1 = fdb_iterator_seek(pfStack_b28,"b0",2,'\x01');
    if (fVar1 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00115b58;
    pcStack_b38 = (code *)0x115a74;
    fVar1 = fdb_iterator_seek(pfStack_b28,"b0",2,'\x01');
    if (fVar1 == FDB_RESULT_ITERATOR_FAIL) {
      pcStack_b38 = (code *)0x115a87;
      fdb_iterator_close(pfStack_b28);
      pcStack_b38 = (code *)0x115a91;
      fdb_kvs_close(pfStack_b10);
      pcStack_b38 = (code *)0x115a9b;
      fdb_kvs_close(pfStack_b18);
      pcStack_b38 = (code *)0x115aa5;
      fdb_close(pfStack_b08);
      lVar8 = 0;
      do {
        pcStack_b38 = (code *)0x115ab1;
        fdb_doc_free(*(fdb_doc **)(auStack_ae0 + lVar8 * 8));
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      pcStack_b38 = (code *)0x115abf;
      fdb_shutdown();
      pcStack_b38 = (code *)0x115ac4;
      memleak_end();
      pcVar9 = "%s PASSED\n";
      if (iterator_inmem_snapshot_seek_test(bool)::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pcStack_b38 = (code *)0x115af5;
      fprintf(_stderr,pcVar9,"in-memory snapshot seek test");
      return;
    }
  }
  else {
    pcStack_b38 = (code *)0x115b0c;
    iterator_inmem_snapshot_seek_test();
LAB_00115b0c:
    pcStack_b38 = (code *)0x115b11;
    iterator_inmem_snapshot_seek_test();
LAB_00115b11:
    pcStack_b38 = (code *)0x115b16;
    iterator_inmem_snapshot_seek_test();
LAB_00115b16:
    pcStack_b38 = (code *)0x115b1b;
    iterator_inmem_snapshot_seek_test();
LAB_00115b1b:
    pcStack_b38 = (code *)0x115b20;
    iterator_inmem_snapshot_seek_test();
LAB_00115b20:
    pcStack_b38 = (code *)0x115b25;
    iterator_inmem_snapshot_seek_test();
LAB_00115b25:
    pcStack_b38 = (code *)0x115b2a;
    iterator_inmem_snapshot_seek_test();
LAB_00115b2a:
    pcStack_b38 = (code *)0x115b2f;
    iterator_inmem_snapshot_seek_test();
LAB_00115b2f:
    pcStack_b38 = (code *)0x115b34;
    iterator_inmem_snapshot_seek_test();
LAB_00115b34:
    doc_00 = pfVar7;
    pcStack_b38 = (code *)0x115b39;
    iterator_inmem_snapshot_seek_test();
LAB_00115b39:
    pcStack_b38 = (code *)0x115b41;
    iterator_inmem_snapshot_seek_test();
LAB_00115b41:
    pcStack_b38 = (code *)0x115b46;
    iterator_inmem_snapshot_seek_test();
LAB_00115b46:
    pcStack_b38 = (code *)0x115b4b;
    iterator_inmem_snapshot_seek_test();
LAB_00115b4b:
    pfVar7 = doc_00;
    pcStack_b38 = (code *)0x115b50;
    iterator_inmem_snapshot_seek_test();
LAB_00115b50:
    pcStack_b38 = (code *)0x115b58;
    iterator_inmem_snapshot_seek_test();
LAB_00115b58:
    pcStack_b38 = (code *)0x115b5d;
    iterator_inmem_snapshot_seek_test();
  }
  pcStack_b38 = iterator_no_deletes_test;
  iterator_inmem_snapshot_seek_test();
  ppfStack_f10 = (fdb_doc **)0x115b82;
  pfStack_b60 = pfVar7;
  pfStack_b58 = unaff_R12;
  pfStack_b50 = unaff_R13;
  pvStack_b48 = __s1;
  pcStack_b40 = unaff_R15;
  pcStack_b38 = (code *)sVar4;
  gettimeofday(&tStack_e88,(__timezone_ptr_t)0x0);
  ppfStack_f10 = (fdb_doc **)0x115b87;
  memleak_start();
  pfStack_ef8 = (fdb_doc *)0x0;
  ppfStack_f10 = (fdb_doc **)0x115b9c;
  system("rm -rf  iterator_test* > errorlog.txt");
  ppfStack_f10 = (fdb_doc **)0x115bac;
  fdb_get_default_config();
  ppfStack_f10 = (fdb_doc **)0x115bbc;
  fdb_get_default_kvs_config();
  fStack_e60.wal_threshold = 0x400;
  fStack_e60.flags = 1;
  fStack_e60.compaction_threshold = '\0';
  ppfStack_f10 = (fdb_doc **)0x115be6;
  fdb_open(&pfStack_ee0,"./iterator_test",&fStack_e60);
  ppfStack_f10 = (fdb_doc **)0x115bfd;
  fdb_kvs_open(pfStack_ee0,&pfStack_ef0,"all_docs",&fStack_e78);
  lVar8 = 0;
  uVar11 = 0;
  do {
    ppfStack_f10 = (fdb_doc **)0x115c27;
    sprintf(acStack_c68,"key%d",uVar11 & 0xffffffff);
    ppfStack_f10 = (fdb_doc **)0x115c3b;
    sprintf(acStack_d68,"body%d",uVar11 & 0xffffffff);
    doc_02 = (fdb_doc **)((long)apfStack_ed8 + lVar8);
    ppfStack_f10 = (fdb_doc **)0x115c4b;
    sVar4 = strlen(acStack_c68);
    ppfStack_f10 = (fdb_doc **)0x115c56;
    sVar5 = strlen(acStack_d68);
    ppfStack_f10 = (fdb_doc **)0x115c70;
    fdb_doc_create(doc_02,acStack_c68,sVar4,(void *)0x0,0,acStack_d68,sVar5);
    ppfStack_f10 = (fdb_doc **)0x115c7f;
    fdb_set(pfStack_ef0,apfStack_ed8[uVar11]);
    uVar11 = uVar11 + 1;
    lVar8 = lVar8 + 8;
  } while (uVar11 != 10);
  doc_01 = (fdb_doc **)0x0;
  do {
    ppfStack_f10 = (fdb_doc **)0x115ca4;
    fVar1 = fdb_del_kv(pfStack_ef0,apfStack_ed8[(long)doc_01]->key,
                       apfStack_ed8[(long)doc_01]->keylen);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      ppfStack_f10 = (fdb_doc **)0x115e0c;
      iterator_no_deletes_test();
      goto LAB_00115e0c;
    }
    doc_01 = (fdb_doc **)((long)doc_01 + 1);
  } while (doc_01 != (fdb_doc **)0xa);
  ppfStack_f10 = (fdb_doc **)0x115cc1;
  fdb_commit(pfStack_ee0,'\0');
  ppfStack_f10 = (fdb_doc **)0x115cd0;
  fVar1 = fdb_set(pfStack_ef0,apfStack_ed8[2]);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    doc_01 = &pfStack_ef8;
    ppfStack_f10 = (fdb_doc **)0x115d01;
    fdb_doc_create(doc_01,apfStack_ed8[2]->key,apfStack_ed8[2]->keylen,(void *)0x0,0,(void *)0x0,0);
    ppfStack_f10 = (fdb_doc **)0x115d0e;
    fVar1 = fdb_get(pfStack_ef0,pfStack_ef8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00115e11;
    if (pfStack_ef8->deleted != false) {
      ppfStack_f10 = (fdb_doc **)0x115d2b;
      iterator_no_deletes_test();
    }
    ppfStack_f10 = (fdb_doc **)0x115d35;
    fdb_doc_free(pfStack_ef8);
    pfStack_ef8 = (fdb_doc *)0x0;
    ppfStack_f10 = (fdb_doc **)0x115d5e;
    fVar1 = fdb_iterator_init(pfStack_ef0,&pfStack_ee8,(void *)0x0,0,(void *)0x0,0,2);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      ppfStack_f10 = (fdb_doc **)0x115d75;
      fVar1 = fdb_iterator_get(pfStack_ee8,&pfStack_ef8);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        ppfStack_f10 = (fdb_doc **)0x115d87;
        fdb_doc_free(pfStack_ef8);
        ppfStack_f10 = (fdb_doc **)0x115d91;
        fdb_iterator_close(pfStack_ee8);
        lVar8 = 0;
        do {
          ppfStack_f10 = (fdb_doc **)0x115d9d;
          fdb_doc_free(apfStack_ed8[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 10);
        ppfStack_f10 = (fdb_doc **)0x115db0;
        fdb_kvs_close(pfStack_ef0);
        ppfStack_f10 = (fdb_doc **)0x115dba;
        fdb_close(pfStack_ee0);
        ppfStack_f10 = (fdb_doc **)0x115dbf;
        fdb_shutdown();
        ppfStack_f10 = (fdb_doc **)0x115dc4;
        memleak_end();
        pcVar9 = "%s PASSED\n";
        if (iterator_no_deletes_test()::__test_pass != '\0') {
          pcVar9 = "%s FAILED\n";
        }
        ppfStack_f10 = (fdb_doc **)0x115df5;
        fprintf(_stderr,pcVar9,"iterator no deletes test");
        return;
      }
      goto LAB_00115e1b;
    }
  }
  else {
LAB_00115e0c:
    ppfStack_f10 = (fdb_doc **)0x115e11;
    iterator_no_deletes_test();
LAB_00115e11:
    ppfStack_f10 = (fdb_doc **)0x115e16;
    iterator_no_deletes_test();
  }
  ppfStack_f10 = (fdb_doc **)0x115e1b;
  iterator_no_deletes_test();
LAB_00115e1b:
  ppfStack_f10 = (fdb_doc **)iterator_set_del_docs_test;
  iterator_no_deletes_test();
  ppfStack_f38 = doc_01;
  pcStack_f30 = acStack_d68;
  uStack_f28 = uVar11;
  pcStack_f20 = acStack_c68;
  lStack_f18 = lVar8;
  ppfStack_f10 = doc_02;
  gettimeofday(&tStack_1688,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  iterator_test* > errorlog.txt");
  fStack_1238.wal_threshold = 0x400;
  fStack_1238.flags = 1;
  fStack_1238.compaction_threshold = '\n';
  fStack_1238.purging_interval = 1;
  fdb_open(&pfStack_16d0,"./iterator_test1",&fStack_1238);
  fdb_kvs_open(pfStack_16d0,&pfStack_16f0,"kv1",&fStack_1678);
  uStack_16e0 = 0;
  uVar3 = 0;
  do {
    lVar8 = 0;
    uVar11 = 0;
    uStack_16e4 = uVar3;
    do {
      uVar3 = uStack_16e4;
      sprintf(acStack_1040,"key%02d%03d",(ulong)uStack_16e4,uVar11 & 0xffffffff);
      sprintf(acStack_1140,"meta%02d%03d",(ulong)uVar3,uVar11 & 0xffffffff);
      sprintf(acStack_1660,"body%02d%03d",(ulong)uVar3,uVar11 & 0xffffffff);
      ppfStack_16c8 = (fdb_doc **)((long)apfStack_1560 + lVar8);
      sVar4 = strlen(acStack_1040);
      sVar5 = strlen(acStack_1140);
      sVar6 = strlen(acStack_1660);
      fdb_doc_create(ppfStack_16c8,acStack_1040,sVar4,acStack_1140,sVar5,acStack_1660,sVar6);
      fdb_set(pfStack_16f0,apfStack_1560[uVar11]);
      uVar11 = uVar11 + 1;
      lVar8 = lVar8 + 8;
    } while (uVar11 != 100);
    fdb_commit(pfStack_16d0,'\x01');
    lVar8 = 0;
    do {
      fdb_del(pfStack_16f0,apfStack_1560[lVar8 + 0x19]);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x19);
    uVar11 = uStack_16e0 + 0x4b;
    fdb_commit(pfStack_16d0,'\x01');
    fdb_get_kvs_info(pfStack_16f0,&fStack_16b8);
    uStack_16e0 = uVar11;
    if (fStack_16b8.doc_count != uVar11) {
      uVar10 = 0;
      fdb_iterator_init(pfStack_16f0,&pfStack_16d8,(void *)0x0,0,(void *)0x0,0,0);
      do {
        fdb_iterator_get(pfStack_16d8,&pfStack_16c0);
        uVar10 = (ulong)((int)uVar10 + (pfStack_16c0->deleted ^ 1));
        fdb_doc_free(pfStack_16c0);
        fVar1 = fdb_iterator_next(pfStack_16d8);
      } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
      fdb_iterator_close(pfStack_16d8);
      uVar11 = uStack_16e0;
      printf("dbdocs(%d) expected(%d)\n",uVar10,uStack_16e0 & 0xffffffff);
    }
    if (fStack_16b8.doc_count != uVar11) {
      iterator_set_del_docs_test();
    }
    lVar8 = 0;
    do {
      fdb_doc_free(apfStack_1560[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 100);
    uVar3 = uStack_16e4 + 1;
  } while (uVar3 != 0x14);
  fdb_kvs_close(pfStack_16f0);
  fdb_close(pfStack_16d0);
  fdb_shutdown();
  memleak_end();
  pcVar9 = "%s PASSED\n";
  if (iterator_set_del_docs_test()::__test_pass != '\0') {
    pcVar9 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar9,"iterator set del docs");
  return;
}

Assistant:

void iterator_extreme_key_test()
{
    TEST_INIT();

    int n = 30;
    int i, r, c;
    char cmd[256];
    char key[256], value[256];
    char keyBuf[256], valueBuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc = NULL;
    fdb_iterator *fit;
    fdb_status s;

    sprintf(cmd, SHELL_DEL " iterator_test*");
    r = system(cmd);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    s = fdb_open(&dbfile, "./iterator_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(key, 0xff, 256);
    for (i=1;i<n;i+=1){
        sprintf(value, "0xff length %d", (int)i);
        fdb_set_kv(db, key, i, value, strlen(value)+1);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // Pre-allocate iterator return document memory and re-use the same
    s = fdb_doc_create(&doc, NULL, 0, NULL, 0, NULL, 0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    doc->key = &keyBuf[0];
    doc->meta = NULL;
    doc->body = &valueBuf[0];

    s = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    c = n-1;
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    i = 8;
    c = i;
    s = fdb_iterator_seek(fit, key, i, FDB_ITR_SEEK_LOWER);
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    i = 8;
    c = i;
    s = fdb_iterator_seek(fit, key, i, FDB_ITR_SEEK_LOWER);
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_next(fit);
        c++;
    }

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // Initialize iterator to an extreme non-existent end_key
    s = fdb_iterator_init(db, &fit, NULL, 0, key, 256, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    c = n-1;
    while (s == FDB_RESULT_SUCCESS) {
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        sprintf(value, "0xff length %d", (int)c);
        TEST_CMP(doc->body, value, doc->bodylen);
        s = fdb_iterator_prev(fit);
        c--;
    }

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // Release pre-allocated iterator return document buffer space
    doc->key = NULL;
    doc->body = NULL;
    s = fdb_doc_free(doc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    memleak_end();
    TEST_RESULT("iterator extreme key test");
}